

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall Fl_X::set_icons(Fl_X *this)

{
  size_t local_20;
  size_t net_wm_icons_size;
  unsigned_long *net_wm_icons;
  Fl_X *this_local;
  
  net_wm_icons = &this->xid;
  if (*(int *)(this->w->icon_ + 0x10) == 0) {
    net_wm_icons_size = (size_t)default_net_wm_icons;
    local_20 = default_net_wm_icons_size;
  }
  else {
    icons_to_property(*(Fl_RGB_Image ***)(this->w->icon_ + 8),*(int *)(this->w->icon_ + 0x10),
                      (unsigned_long **)&net_wm_icons_size,&local_20);
  }
  XChangeProperty(fl_display,this->xid,fl_NET_WM_ICON,6,0x20,0,net_wm_icons_size,(int)local_20);
  if ((*(int *)(this->w->icon_ + 0x10) != 0) && (net_wm_icons_size != 0)) {
    operator_delete__((void *)net_wm_icons_size);
  }
  return;
}

Assistant:

void Fl_X::set_icons() {
  unsigned long *net_wm_icons;
  size_t net_wm_icons_size;

  if (w->icon_->count) {
    icons_to_property((const Fl_RGB_Image **)w->icon_->icons, w->icon_->count,
                      &net_wm_icons, &net_wm_icons_size);
  } else {
    net_wm_icons = default_net_wm_icons;
    net_wm_icons_size = default_net_wm_icons_size;
  }

  XChangeProperty (fl_display, xid, fl_NET_WM_ICON, XA_CARDINAL, 32,
      PropModeReplace, (unsigned char*) net_wm_icons, net_wm_icons_size);

  if (w->icon_->count) {
    delete [] net_wm_icons;
    net_wm_icons = 0L;
    net_wm_icons_size = 0;
  }
}